

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandardgestures.cpp
# Opt level: O2

QPointF panOffset(QList<QEventPoint> *touchPoints,int maxCount)

{
  undefined1 auVar1 [16];
  P _a;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double in_XMM1_Qa;
  undefined1 auVar8 [16];
  QPointF QVar9;
  double local_38;
  double dStack_30;
  
  uVar2 = (touchPoints->d).size;
  uVar3 = (long)maxCount;
  if ((long)uVar2 < (long)maxCount) {
    uVar3 = uVar2;
  }
  lVar4 = 0;
  uVar2 = 0;
  if (0 < (int)uVar3) {
    uVar2 = uVar3 & 0xffffffff;
  }
  auVar8 = ZEXT816(0);
  for (; uVar2 * 8 != lVar4; lVar4 = lVar4 + 8) {
    dVar5 = (double)QEventPoint::position();
    dVar7 = in_XMM1_Qa;
    dVar6 = (double)QEventPoint::pressPosition();
    local_38 = auVar8._0_8_;
    dStack_30 = auVar8._8_8_;
    auVar8._0_8_ = local_38 + (dVar5 - dVar6);
    auVar8._8_8_ = dStack_30 + (in_XMM1_Qa - dVar7);
    in_XMM1_Qa = dVar7;
  }
  dVar7 = (double)(int)uVar3;
  auVar1._8_8_ = dVar7;
  auVar1._0_8_ = dVar7;
  QVar9 = (QPointF)divpd(auVar8,auVar1);
  return QVar9;
}

Assistant:

static QPointF panOffset(const QList<QEventPoint> &touchPoints, int maxCount)
{
    QPointF result;
    const int count = qMin(touchPoints.size(), maxCount);
    for (int p = 0; p < count; ++p)
        result += touchPoints.at(p).position() - touchPoints.at(p).pressPosition();
    return result / qreal(count);
}